

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O2

void __thiscall flatbuffers::python::Version::Version(Version *this,string *version)

{
  istream *piVar1;
  char dot;
  stringstream ss;
  
  this->major = 0;
  this->minor = 0;
  this->micro = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)version,_S_out|_S_in);
  piVar1 = (istream *)std::istream::operator>>((istream *)&ss,&this->major);
  piVar1 = std::operator>>(piVar1,&dot);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&this->minor);
  piVar1 = std::operator>>(piVar1,&dot);
  std::istream::operator>>(piVar1,&this->micro);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

Version::Version(const std::string &version) {
  std::stringstream ss(version);
  char dot;
  ss >> major >> dot >> minor >> dot >> micro;
}